

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O2

uint Fossilize::default_get_member_uint(Value *value,char *member,uint default_value)

{
  uint uVar1;
  Value *this;
  
  this = maybe_get_member(value,member);
  if ((this != (Value *)0x0) &&
     ((undefined1  [16])((undefined1  [16])this->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0)) {
    uVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(this);
    return uVar1;
  }
  return 0;
}

Assistant:

static unsigned default_get_member_uint(const Value &value, const char *member, unsigned default_value = 0)
{
	auto *memb = maybe_get_member(value, member);
	if (!memb)
		return default_value;
	if (!memb->IsUint())
		return default_value;
	return memb->GetUint();
}